

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall cs::numeric::numeric<long_double>(numeric *this,longdouble *dat)

{
  longdouble *dat_local;
  numeric *this_local;
  
  this->type = true;
  this->type = false;
  *(longdouble *)&this->data = *dat;
  return;
}

Assistant:

numeric(const T &dat)
		{
			if (std::is_integral<T>::value) {
				type = 1;
				data._int = dat;
			}
			else {
				type = 0;
				data._num = dat;
			}
		}